

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gp3p_main
               (Matrix3d *f,Matrix3d *v,Matrix3d *p,transformations_t *solutions)

{
  double *pdVar1;
  long lVar2;
  size_t i;
  long lVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  complex<double> *pcVar7;
  complex<double> *__x;
  point_t temp;
  transformation_t transformation;
  point_t center_world;
  point_t center_cam;
  Vector3d n;
  cayley_t cayley;
  translation_t translation;
  rotation_t rotation;
  Matrix<std::complex<double>,_8,_1,_0,_8,_1> D;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<double,_8,_8,_0,_8,_8> M;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  Matrix<double,_48,_85,_0,_48,_85> groebnerMatrix;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> local_9450;
  undefined1 local_9420 [24];
  Matrix3d *local_9408;
  variable_if_dynamic<long,__1> local_9400;
  variable_if_dynamic<long,__1> local_93f8;
  Index local_93f0;
  Matrix3d *local_93e8;
  undefined8 local_93e0;
  double local_93d8 [3];
  double *local_93c0;
  Matrix3d *local_93b0;
  undefined8 local_93a8;
  double local_93a0;
  undefined8 local_9398;
  Matrix<double,_3,_1,_0,_3,_1> local_9380;
  Matrix<double,_3,_1,_0,_3,_1> local_9368;
  double adStack_9350 [3];
  cayley_t local_9338;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_9320 [24];
  rotation_t local_9308;
  undefined8 local_92c0;
  double adStack_92b8 [15];
  undefined1 local_9240 [24];
  variable_if_dynamic<long,__1> local_9228;
  variable_if_dynamic<long,__1> vStack_9220;
  Index local_9218;
  complex<double> local_9200 [3];
  complex<double> local_91d0 [57];
  PlainObjectBase<Eigen::Matrix<double,8,8,0,8,8>> local_8e40 [48];
  undefined8 local_8e10;
  undefined8 local_8c88;
  undefined1 local_8c40 [3136];
  PlainObjectBase<Eigen::Matrix<double,48,85,0,48,85>> local_8000 [29856];
  double local_b60 [358];
  
  local_8c40._8_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,48,85,0,48,85>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,85,0,48,85>>>
            (local_8000,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_48,_85,_0,_48,_85>_>_>
              *)local_8c40);
  gp3p::init((EVP_PKEY_CTX *)local_8000);
  gp3p::compute((Matrix<double,_48,_85,_0,_48,_85> *)local_8000);
  local_8c40._8_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,8,0,8,8>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,8,8,0,8,8>>>
            (local_8e40,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_8,_8,_0,_8,_8>_>_>
              *)local_8c40);
  local_8c40._0_8_ = local_b60;
  local_8c40._24_8_ = 0x24;
  local_8c40._32_8_ = 0x4d;
  local_9228.m_value = 0;
  vStack_9220.m_value = 0;
  local_8c40._40_8_ = 2.37151510003798e-322;
  local_9218 = 8;
  local_9240._0_8_ = local_8e40;
  local_9240._16_8_ = local_8e40;
  local_8c40._16_8_ = local_8000;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,8,0,8,8>,6,8,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,48,85,0,48,85>,6,8,false>const>>
            ((Block<Eigen::Matrix<double,_8,_8,_0,_8,_8>,_6,_8,_false> *)local_9240,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_6,_8,_false>_>
              *)local_8c40);
  local_8e10 = 0x3ff0000000000000;
  local_8c88 = 0x3ff0000000000000;
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>
            ((EigenSolver<Eigen::Matrix<double,8,8,0,8,8>> *)local_8c40,
             (EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *)local_8e40,true);
  adStack_92b8[7] = (double)local_8c40._576_8_;
  adStack_92b8[8] = (double)local_8c40._584_8_;
  adStack_92b8[9] = (double)local_8c40._592_8_;
  adStack_92b8[10] = (double)local_8c40._600_8_;
  adStack_92b8[0xb] = (double)local_8c40._608_8_;
  adStack_92b8[0xc] = (double)local_8c40._616_8_;
  adStack_92b8[0xd] = (double)local_8c40._624_8_;
  adStack_92b8[0xe] = (double)local_8c40._632_8_;
  local_92c0 = local_8c40._512_8_;
  adStack_92b8[0] = (double)local_8c40._520_8_;
  adStack_92b8[1] = (double)local_8c40._528_8_;
  adStack_92b8[2] = (double)local_8c40._536_8_;
  adStack_92b8[3] = (double)local_8c40._544_8_;
  adStack_92b8[4] = (double)local_8c40._552_8_;
  adStack_92b8[5] = (double)local_8c40._560_8_;
  adStack_92b8[6] = (double)local_8c40._568_8_;
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors
            ((EigenvectorsType *)local_9240,
             (EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *)local_8c40);
  pcVar7 = local_9200;
  lVar2 = 0;
  while( true ) {
    dVar4 = 0.0001;
    if (lVar2 == 8) break;
    if (adStack_92b8[lVar2 * 2] < 0.0001) {
      lVar3 = 3;
      __x = pcVar7;
      while (lVar3 != 0) {
        std::operator/(__x,local_91d0 + lVar2 * 8);
        local_9338.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[lVar3 + -1] = dVar4;
        std::operator/(__x + -3,local_91d0 + lVar2 * 8);
        adStack_9350[lVar3 + -1] = dVar4;
        __x = __x + 1;
        lVar3 = lVar3 + -1;
      }
      math::cayley2rot(&local_9308,&local_9338);
      Eigen::internal::inplace_transpose_selector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_true,_false>
      ::run(&local_9308);
      local_9420._8_8_ = (PointerType)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_9368,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_9420);
      local_9420._8_8_ = (double *)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_9380,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_9420);
      pdVar1 = (double *)f;
      pdVar5 = (double *)v;
      pdVar6 = (double *)p;
      for (dVar4 = 0.0; dVar4 != 1.48219693752374e-323; dVar4 = (double)((long)dVar4 + 1)) {
        local_9400.m_value = (long)adStack_9350[(long)dVar4];
        local_9420._0_8_ = &local_9308;
        local_93e0 = 0;
        local_93d8[1] = 1.48219693752374e-323;
        local_93a8 = 0;
        local_9398 = 3;
        local_93f8.m_value = (long)pdVar1;
        local_93e8 = f;
        local_93d8[0] = dVar4;
        local_93c0 = pdVar5;
        local_93b0 = v;
        local_93a0 = dVar4;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_9450,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_0>_>
                    *)local_9420);
        local_9420._0_8_ = &local_9368;
        local_9420._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_9450;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)local_9420._0_8_,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9420);
        local_9420._0_8_ = &local_9380;
        local_9400.m_value = 0;
        local_93f0 = 3;
        local_9420._8_8_ = pdVar6;
        local_9408 = p;
        local_93f8.m_value = (long)dVar4;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)local_9420._0_8_,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                    *)local_9420);
        pdVar6 = pdVar6 + 3;
        pdVar5 = pdVar5 + 3;
        pdVar1 = pdVar1 + 3;
      }
      local_9420._16_8_ = 3.0;
      local_9420._0_8_ = &local_9368;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_9368,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_9420);
      local_9420._16_8_ = 3.0;
      local_9420._0_8_ = &local_9380;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_9380,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_9420);
      local_9420._0_8_ = &local_9380;
      local_9420._8_8_ = &local_9368;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (local_9320,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_9420);
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.
      m_value = 0;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride =
           3;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
           (PointerType)local_9420;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_9420;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)&local_9450,&local_9308
                );
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
           local_93d8;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.
      m_value = 3;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride =
           3;
      local_9450.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_9420;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                (&local_9450,(Matrix<double,_3,_1,_0,_3,_1> *)local_9320);
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back(solutions,(value_type *)local_9420);
    }
    lVar2 = lVar2 + 1;
    pcVar7 = pcVar7 + 8;
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p_main(
    const Eigen::Matrix3d & f,
    const Eigen::Matrix3d & v,
    const Eigen::Matrix3d & p,
    transformations_t & solutions)
{
  Eigen::Matrix<double,48,85> groebnerMatrix =
      Eigen::Matrix<double,48,85>::Zero();
  gp3p::init(groebnerMatrix,f,v,p);
  gp3p::compute(groebnerMatrix);

  Eigen::Matrix<double,8,8> M = Eigen::Matrix<double,8,8>::Zero();
  M.block<6,8>(0,0) = -groebnerMatrix.block<6,8>(36,77);
  M(6,0) = 1.0;
  M(7,6) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,8,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();

  for( int c = 0; c < V.cols(); c++ )
  {
    std::complex<double> eigValue = D[c];

    if( eigValue.imag() < 0.0001 )
    {
      cayley_t cayley;
      Eigen::Vector3d n;

      for(size_t i = 0; i < 3; i++)
      {
        std::complex<double> cay = V(i+4,c)/V(7,c);
        cayley[2-i] = cay.real();
        std::complex<double> depth = V(i+1,c)/V(7,c);
        n[2-i] = depth.real();
      }

      rotation_t rotation = math::cayley2rot(cayley);
      //the groebner problem was set up to find the transpose!
      rotation.transposeInPlace();

      point_t center_cam = Eigen::Vector3d::Zero();
      point_t center_world = Eigen::Vector3d::Zero();
      for( size_t i = 0; i < (size_t) f.cols(); i++ )
      {
        point_t temp = rotation*(n[i]*f.col(i)+v.col(i));
        center_cam = center_cam + temp;
        center_world = center_world + p.col(i);
      }

      center_cam = center_cam/f.cols();
      center_world = center_world/f.cols();
      translation_t translation = center_world - center_cam;

      transformation_t transformation;
      transformation.block<3,3>(0,0) = rotation;
      transformation.col(3) = translation;
      solutions.push_back(transformation);
    }
  }
}